

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int must_hide_file(mg_connection *conn,char *path)

{
  char *pattern_00;
  ptrdiff_t pVar1;
  bool local_31;
  char *pattern;
  char *pw_pattern;
  char *path_local;
  mg_connection *conn_local;
  
  if ((conn == (mg_connection *)0x0) || (conn->dom_ctx == (mg_domain_context *)0x0)) {
    conn_local._4_4_ = 0;
  }
  else {
    pattern_00 = conn->dom_ctx->config[0x2a];
    pVar1 = match_prefix_strlen("**.htpasswd$",path);
    local_31 = true;
    if (pVar1 < 1) {
      pVar1 = match_prefix_strlen(pattern_00,path);
      local_31 = 0 < pVar1;
    }
    conn_local._4_4_ = (uint)local_31;
  }
  return conn_local._4_4_;
}

Assistant:

static int
must_hide_file(struct mg_connection *conn, const char *path)
{
	if (conn && conn->dom_ctx) {
		const char *pw_pattern = "**" PASSWORDS_FILE_NAME "$";
		const char *pattern = conn->dom_ctx->config[HIDE_FILES];
		return (match_prefix_strlen(pw_pattern, path) > 0)
		       || (match_prefix_strlen(pattern, path) > 0);
	}
	return 0;
}